

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZHelpers.h
# Opt level: O0

optional<NetAction> s_try_recv<NetAction>(socket_t *socket)

{
  bool bVar1;
  optional<NetAction> *this;
  size_t __n;
  NetAction val;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  response;
  socket_t *in_stack_00000058;
  NetAction *in_stack_ffffffffffffffa8;
  undefined4 local_44;
  undefined4 local_40;
  _Optional_payload_base<NetAction> local_8;
  
  s_recv_raw_abi_cxx11_(in_stack_00000058);
  bVar1 = std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::has_value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x158a42);
  if (bVar1) {
    local_44 = 0;
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x158a6c);
    this = (optional<NetAction> *)std::__cxx11::string::data();
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x158a83);
    __n = std::__cxx11::string::size();
    memcpy(&local_44,this,__n);
    std::optional<NetAction>::optional<NetAction,_true>(this,in_stack_ffffffffffffffa8);
  }
  else {
    std::optional<NetAction>::optional((optional<NetAction> *)&local_8);
  }
  local_40 = 1;
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x158abe);
  return (optional<NetAction>)local_8;
}

Assistant:

std::optional<T> s_try_recv(zmq::socket_t *socket) {
    static_assert(is_transferable<T>::value, "Cannot transfer this type");
    auto response{s_recv_raw(socket)};
    if (!response.has_value()) {
        return std::nullopt;
    }

    T val{};
    assert(sizeof(T) == response->size());
    ::memcpy(&val, response->data(), response->size());
    return val;
}